

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O3

int readModRM(InternalInstruction *insn)

{
  uint8_t uVar1;
  byte bVar2;
  int iVar3;
  byte bVar4;
  EABase EVar5;
  byte bVar6;
  undefined8 uVar7;
  
  if (insn->consumedModRM != false) {
    return 0;
  }
  iVar3 = (*insn->reader)((reader_info *)insn->readerArg,&insn->modRM,insn->readerCursor);
  if (iVar3 != 0) {
    return -1;
  }
  insn->readerCursor = insn->readerCursor + 1;
  insn->consumedModRM = true;
  bVar2 = insn->modRM;
  insn->orgModRM = bVar2;
  if (((insn->firstByte == '\x0f') && (insn->opcodeType == TWOBYTE)) &&
     ((insn->opcode & 0xfc) == 0x20)) {
    bVar2 = bVar2 | 0xc0;
    insn->modRM = bVar2;
  }
  uVar1 = insn->registerSize;
  if (uVar1 == '\x02') {
    uVar7 = 0x1400000045;
  }
  else if (uVar1 == '\b') {
    uVar7 = 0x3400000065;
  }
  else {
    if (uVar1 != '\x04') goto LAB_0019fd35;
    uVar7 = 0x2400000055;
  }
  insn->eaRegBase = (int)uVar7;
  insn->regBase = (int)((ulong)uVar7 >> 0x20);
LAB_0019fd35:
  bVar6 = insn->rexPrefix * '\x02' & 8 | bVar2 >> 3 & 7;
  bVar4 = (insn->rexPrefix & 1) << 3 | bVar2 & 7;
  if (insn->vectorExtensionType == TYPE_EVEX) {
    bVar6 = ~insn->vectorExtensionPrefix[1] & 0x10 | bVar6;
    bVar4 = (byte)~insn->vectorExtensionPrefix[1] >> 2 & 0x10 | bVar4;
  }
  insn->reg = (uint)bVar6 + insn->regBase;
  uVar1 = insn->addressSize;
  if ((uVar1 != '\b') && (uVar1 != '\x04')) {
    if (uVar1 != '\x02') {
      return 0;
    }
    insn->eaBaseBase = EA_BASE_BX_SI;
    iVar3 = (*(code *)(&DAT_001eb258 + *(int *)(&DAT_001eb258 + (ulong)(bVar2 >> 6) * 4)))();
    return iVar3;
  }
  EVar5 = (uint)(uVar1 != '\x04') * 0x10 + EA_BASE_EAX;
  insn->eaBaseBase = EVar5;
  iVar3 = (*(code *)(&DAT_001eb220 + *(int *)(&DAT_001eb220 + (ulong)(bVar2 >> 6) * 4)))
                    (&DAT_001eb220 + *(int *)(&DAT_001eb220 + (ulong)(bVar2 >> 6) * 4),uVar1,EVar5,
                     bVar4);
  return iVar3;
}

Assistant:

static int readModRM(struct InternalInstruction *insn)
{
	uint8_t mod, rm, reg;

	// dbgprintf(insn, "readModRM()");

	// already got ModRM byte?
	if (insn->consumedModRM)
		return 0;

	if (consumeByte(insn, &insn->modRM))
		return -1;

	// mark that we already got ModRM
	insn->consumedModRM = true;

	// save original ModRM for later reference
	insn->orgModRM = insn->modRM;

	// handle MOVcr, MOVdr, MOVrc, MOVrd by pretending they have MRM.mod = 3
	if ((insn->firstByte == 0x0f && insn->opcodeType == TWOBYTE) &&
			(insn->opcode >= 0x20 && insn->opcode <= 0x23 ))
		insn->modRM |= 0xC0;

	mod     = modFromModRM(insn->modRM);
	rm      = rmFromModRM(insn->modRM);
	reg     = regFromModRM(insn->modRM);

	/*
	 * This goes by insn->registerSize to pick the correct register, which messes
	 * up if we're using (say) XMM or 8-bit register operands.  That gets fixed in
	 * fixupReg().
	 */
	switch (insn->registerSize) {
		case 2:
			insn->regBase = MODRM_REG_AX;
			insn->eaRegBase = EA_REG_AX;
			break;
		case 4:
			insn->regBase = MODRM_REG_EAX;
			insn->eaRegBase = EA_REG_EAX;
			break;
		case 8:
			insn->regBase = MODRM_REG_RAX;
			insn->eaRegBase = EA_REG_RAX;
			break;
	}

	reg |= rFromREX(insn->rexPrefix) << 3;
	rm  |= bFromREX(insn->rexPrefix) << 3;
	if (insn->vectorExtensionType == TYPE_EVEX) {
		reg |= r2FromEVEX2of4(insn->vectorExtensionPrefix[1]) << 4;
		rm  |=  xFromEVEX2of4(insn->vectorExtensionPrefix[1]) << 4;
	}

	insn->reg = (Reg)(insn->regBase + reg);

	switch (insn->addressSize) {
		case 2:
			insn->eaBaseBase = EA_BASE_BX_SI;

			switch (mod) {
				case 0x0:
					if (rm == 0x6) {
						insn->eaBase = EA_BASE_NONE;
						insn->eaDisplacement = EA_DISP_16;
						if (readDisplacement(insn))
							return -1;
					} else {
						insn->eaBase = (EABase)(insn->eaBaseBase + rm);
						insn->eaDisplacement = EA_DISP_NONE;
					}
					break;
				case 0x1:
					insn->eaBase = (EABase)(insn->eaBaseBase + rm);
					insn->eaDisplacement = EA_DISP_8;
					insn->displacementSize = 1;
					if (readDisplacement(insn))
						return -1;
					break;
				case 0x2:
					insn->eaBase = (EABase)(insn->eaBaseBase + rm);
					insn->eaDisplacement = EA_DISP_16;
					if (readDisplacement(insn))
						return -1;
					break;
				case 0x3:
					insn->eaBase = (EABase)(insn->eaRegBase + rm);
					if (readDisplacement(insn))
						return -1;
					break;
			}
			break;
		case 4:
		case 8:
			insn->eaBaseBase = (insn->addressSize == 4 ? EA_BASE_EAX : EA_BASE_RAX);

			switch (mod) {
				case 0x0:
					insn->eaDisplacement = EA_DISP_NONE; /* readSIB may override this */
					switch (rm) {
						case 0x14:
						case 0x4:
						case 0xc:   /* in case REXW.b is set */
							insn->eaBase = (insn->addressSize == 4 ?
									EA_BASE_sib : EA_BASE_sib64);
							if (readSIB(insn) || readDisplacement(insn))
								return -1;
							break;
						case 0x5:
						case 0xd:
							insn->eaBase = EA_BASE_NONE;
							insn->eaDisplacement = EA_DISP_32;
							if (readDisplacement(insn))
								return -1;
							break;
						default:
							insn->eaBase = (EABase)(insn->eaBaseBase + rm);
							break;
					}

					break;
				case 0x1:
					insn->displacementSize = 1;
					/* FALLTHROUGH */
				case 0x2:
					insn->eaDisplacement = (mod == 0x1 ? EA_DISP_8 : EA_DISP_32);
					switch (rm) {
						case 0x14:
						case 0x4:
						case 0xc:   /* in case REXW.b is set */
							insn->eaBase = EA_BASE_sib;
							if (readSIB(insn) || readDisplacement(insn))
								return -1;
							break;
						default:
							insn->eaBase = (EABase)(insn->eaBaseBase + rm);
							if (readDisplacement(insn))
								return -1;
							break;
					}
					break;
				case 0x3:
					insn->eaDisplacement = EA_DISP_NONE;
					insn->eaBase = (EABase)(insn->eaRegBase + rm);
					break;
			}
			break;
	} /* switch (insn->addressSize) */

	return 0;
}